

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

void __thiscall cs_impl::init_extensions(cs_impl *this)

{
  if (init_extensions()::extensions_initiator != '\0') {
    return;
  }
  init_extensions()::extensions_initiator = 1;
  member_visitor_cs_ext::init((EVP_PKEY_CTX *)this);
  iostream_cs_ext::init((EVP_PKEY_CTX *)this);
  charbuff_cs_ext::init((EVP_PKEY_CTX *)this);
  istream_cs_ext::init((EVP_PKEY_CTX *)this);
  ostream_cs_ext::init((EVP_PKEY_CTX *)this);
  system_cs_ext::init((EVP_PKEY_CTX *)this);
  time_cs_ext::init((EVP_PKEY_CTX *)this);
  channel_cs_ext::init((EVP_PKEY_CTX *)this);
  runtime_cs_ext::init((EVP_PKEY_CTX *)this);
  math_cs_ext::init((EVP_PKEY_CTX *)this);
  except_cs_ext::init((EVP_PKEY_CTX *)this);
  number_cs_ext::init((EVP_PKEY_CTX *)this);
  char_cs_ext::init((EVP_PKEY_CTX *)this);
  string_cs_ext::init((EVP_PKEY_CTX *)this);
  list_cs_ext::init((EVP_PKEY_CTX *)this);
  array_cs_ext::init((EVP_PKEY_CTX *)this);
  pair_cs_ext::init((EVP_PKEY_CTX *)this);
  hash_set_cs_ext::init((EVP_PKEY_CTX *)this);
  hash_map_cs_ext::init((EVP_PKEY_CTX *)this);
  return;
}

Assistant:

void init_extensions()
	{
		static bool extensions_initiator = true;
		if (extensions_initiator) {
			extensions_initiator = false;
			member_visitor_cs_ext::init();
			iostream_cs_ext::init();
			charbuff_cs_ext::init();
			istream_cs_ext::init();
			ostream_cs_ext::init();
			system_cs_ext::init();
			time_cs_ext::init();
			channel_cs_ext::init();
			runtime_cs_ext::init();
			math_cs_ext::init();
			except_cs_ext::init();
			number_cs_ext::init();
			char_cs_ext::init();
			string_cs_ext::init();
			list_cs_ext::init();
			array_cs_ext::init();
			pair_cs_ext::init();
			hash_set_cs_ext::init();
			hash_map_cs_ext::init();
		}
	}